

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_cxb(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGTemp *local_38;
  TCGv_i64 local_30;
  TCGv_i64 local_28;
  TCGv_i64 local_20;
  TCGv_i64 local_18;
  
  tcg_ctx = s->uc->tcg_ctx;
  local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_30 = o->out + (long)tcg_ctx;
  local_28 = o->out2 + (long)tcg_ctx;
  local_20 = o->in1 + (long)tcg_ctx;
  local_18 = o->in2 + (long)tcg_ctx;
  tcg_gen_callN_s390x(tcg_ctx,helper_cxb,(TCGTemp *)(tcg_ctx->cc_op + (long)tcg_ctx),5,&local_38);
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_cxb(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_cxb(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, o->out, o->out2, o->in1, o->in2);
    set_cc_static(s);
    return DISAS_NEXT;
}